

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yy_shift(fts5yyParser *fts5yypParser,uchar fts5yyNewState,uchar fts5yyMajor,
                 Fts5Token fts5yyMinor)

{
  fts5yyStackEntry *pfVar1;
  fts5yyStackEntry *fts5yytos;
  uchar fts5yyMajor_local;
  uchar fts5yyNewState_local;
  fts5yyParser *fts5yypParser_local;
  Fts5Token fts5yyMinor_local;
  
  fts5yypParser->fts5yytos = fts5yypParser->fts5yytos + 1;
  if (fts5yypParser->fts5yystackEnd < fts5yypParser->fts5yytos) {
    fts5yypParser->fts5yytos = fts5yypParser->fts5yytos + -1;
    fts5yyStackOverflow(fts5yypParser);
  }
  else {
    fts5yytos._7_1_ = fts5yyNewState;
    if (0x22 < fts5yyNewState) {
      fts5yytos._7_1_ = fts5yyNewState + '\x1f';
    }
    pfVar1 = fts5yypParser->fts5yytos;
    pfVar1->stateno = fts5yytos._7_1_;
    pfVar1->major = fts5yyMajor;
    (pfVar1->minor).fts5yy0.p = fts5yyMinor.p;
    *(ulong *)((long)&pfVar1->minor + 8) = CONCAT44(fts5yyMinor_local.p._4_4_,fts5yyMinor.n);
  }
  return;
}

Assistant:

static void fts5yy_shift(
  fts5yyParser *fts5yypParser,          /* The parser to be shifted */
  fts5YYACTIONTYPE fts5yyNewState,      /* The new state to shift in */
  fts5YYCODETYPE fts5yyMajor,           /* The major token to shift in */
  sqlite3Fts5ParserFTS5TOKENTYPE fts5yyMinor        /* The minor token to shift in */
){
  fts5yyStackEntry *fts5yytos;
  fts5yypParser->fts5yytos++;
#ifdef fts5YYTRACKMAXSTACKDEPTH
  if( (int)(fts5yypParser->fts5yytos - fts5yypParser->fts5yystack)>fts5yypParser->fts5yyhwm ){
    fts5yypParser->fts5yyhwm++;
    assert( fts5yypParser->fts5yyhwm == (int)(fts5yypParser->fts5yytos - fts5yypParser->fts5yystack) );
  }
#endif
#if fts5YYSTACKDEPTH>0 
  if( fts5yypParser->fts5yytos>fts5yypParser->fts5yystackEnd ){
    fts5yypParser->fts5yytos--;
    fts5yyStackOverflow(fts5yypParser);
    return;
  }
#else
  if( fts5yypParser->fts5yytos>=&fts5yypParser->fts5yystack[fts5yypParser->fts5yystksz] ){
    if( fts5yyGrowStack(fts5yypParser) ){
      fts5yypParser->fts5yytos--;
      fts5yyStackOverflow(fts5yypParser);
      return;
    }
  }
#endif
  if( fts5yyNewState > fts5YY_MAX_SHIFT ){
    fts5yyNewState += fts5YY_MIN_REDUCE - fts5YY_MIN_SHIFTREDUCE;
  }
  fts5yytos = fts5yypParser->fts5yytos;
  fts5yytos->stateno = fts5yyNewState;
  fts5yytos->major = fts5yyMajor;
  fts5yytos->minor.fts5yy0 = fts5yyMinor;
  fts5yyTraceShift(fts5yypParser, fts5yyNewState, "Shift");
}